

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

TPZTransform<double> *
pzshape::TPZShapeQuad::ParametricTransform
          (TPZTransform<double> *__return_storage_ptr__,int trans_id)

{
  TPZFNMatrix<9,_double> *this;
  double dVar1;
  double *pdVar2;
  long lVar3;
  
  TPZTransform<double>::TPZTransform(__return_storage_ptr__,2,2);
  lVar3 = (long)trans_id * 0x20;
  dVar1 = *(double *)(gTrans2dQ + lVar3);
  this = &__return_storage_ptr__->fMult;
  pdVar2 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,0);
  *pdVar2 = dVar1;
  dVar1 = *(double *)(gTrans2dQ + lVar3 + 8);
  pdVar2 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,0,1);
  *pdVar2 = dVar1;
  dVar1 = *(double *)(gTrans2dQ + lVar3 + 0x10);
  pdVar2 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,1,0);
  *pdVar2 = dVar1;
  dVar1 = *(double *)(gTrans2dQ + lVar3 + 0x18);
  pdVar2 = TPZFMatrix<double>::operator()(&this->super_TPZFMatrix<double>,1,1);
  *pdVar2 = dVar1;
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<REAL> TPZShapeQuad::ParametricTransform(int trans_id){
        TPZTransform<REAL> trans(2,2);
        trans.Mult()(0,0) = gTrans2dQ[trans_id][0][0];
        trans.Mult()(0,1) = gTrans2dQ[trans_id][0][1];
        trans.Mult()(1,0) = gTrans2dQ[trans_id][1][0];
        trans.Mult()(1,1) = gTrans2dQ[trans_id][1][1];
        return trans;
    }